

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O2

size_t ap_str_strlcpy(char *dst,char *src,size_t size)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  size_t n;
  char *s;
  char *d;
  
  pcVar4 = src;
  if (size == 0) {
LAB_001042e3:
    do {
      pcVar3 = pcVar4 + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar3;
    } while (cVar1 != '\0');
  }
  else {
    lVar2 = 0;
    do {
      if (size - 1 == lVar2) {
        dst[lVar2] = '\0';
        pcVar4 = src + lVar2;
        goto LAB_001042e3;
      }
      cVar1 = src[lVar2];
      dst[lVar2] = cVar1;
      lVar2 = lVar2 + 1;
    } while (cVar1 != '\0');
    pcVar3 = src + lVar2;
  }
  return (size_t)(pcVar3 + ~(ulong)src);
}

Assistant:

size_t ap_str_strlcpy (char *dst, const char *src, size_t size)
{
	char		*d		= dst;
	const char	*s		= src;
	size_t		n		= size;

	/* Copy as many bytes as will fit */
	if (n != 0)
	{
		while (--n != 0)
		{
			if ((*d++ = *s++) == '\0')
			{
				break;
			}
		}
	}

	/* Not enough room in dst, add NUL and traverse rest of src */
	if (n == 0)
	{
		if (size != 0)
		{
			*d = '\0'; /* NUL-terminate dst */
		}
		
		while (*s++);
	}

	return(s - src - 1); /* count does not include NUL */
}